

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void * rollback_during_ops_test(void *args)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __atomic_base<unsigned_long> metalen;
  size_t bodylen;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int *piVar5;
  fdb_config *fconfig;
  char *pcVar6;
  fdb_kvs_handle **ppfVar7;
  uint uVar8;
  uint uVar9;
  fdb_kvs_handle *unaff_RBP;
  ulong uVar10;
  char *pcVar11;
  fdb_kvs_handle **ppfVar12;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  btree *doc;
  fdb_config *fconfig_00;
  fdb_kvs_handle **__s;
  fdb_kvs_handle *pfVar13;
  fdb_config *unaff_R15;
  fdb_kvs_handle *pfVar14;
  int n;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  pthread_t tid;
  char str [15];
  void *thread_ret;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_config config;
  fdb_kvs_handle *pfStack_3140;
  fdb_kvs_handle *pfStack_3138;
  fdb_file_handle *pfStack_3130;
  fdb_iterator *pfStack_3128;
  fdb_doc *pfStack_3120;
  fdb_kvs_handle *pfStack_3118;
  timeval tStack_3110;
  fdb_kvs_config fStack_3100;
  fdb_config fStack_30e8;
  fdb_config *pfStack_2ff0;
  fdb_kvs_handle *pfStack_2fe8;
  fdb_kvs_handle *pfStack_2fe0;
  fdb_file_handle *pfStack_2fd8;
  fdb_kvs_handle *pfStack_2fd0;
  char acStack_2fc7 [15];
  filemgr *pfStack_2fb8;
  docio_handle *pdStack_2fb0;
  btreeblk_handle *pbStack_2fa8;
  size_t sStack_2fa0;
  filemgr *pfStack_2f98;
  docio_handle *pdStack_2f90;
  btreeblk_handle *pbStack_2f88;
  timeval tStack_2f80;
  undefined1 auStack_2f70 [76];
  uint uStack_2f24;
  char *pcStack_2e30;
  atomic<unsigned_long> aStack_2e28;
  btree *pbStack_2e20;
  fdb_kvs_handle *pfStack_2e18;
  fdb_kvs_handle *pfStack_2e10;
  code *pcStack_2e08;
  uint uStack_2df4;
  fdb_txn *pfStack_2df0;
  fdb_kvs_handle *pfStack_2de8;
  fdb_iterator *pfStack_2de0;
  fdb_snapshot_info_t *pfStack_2dd8;
  int iStack_2dcc;
  fdb_kvs_handle *pfStack_2dc8;
  fdb_kvs_handle *apfStack_2dc0 [3];
  uint64_t uStack_2da8;
  fdb_kvs_config fStack_2da0;
  char acStack_2d88 [8];
  timeval tStack_2d80;
  char acStack_2d70 [256];
  btree bStack_2c70;
  char acStack_2c20 [256];
  char acStack_2b20 [256];
  fdb_config fStack_2a20;
  fdb_kvs_handle **ppfStack_2928;
  fdb_kvs_handle **ppfStack_2920;
  fdb_kvs_handle *pfStack_2918;
  fdb_kvs_handle **ppfStack_2910;
  fdb_kvs_handle *pfStack_2908;
  code *pcStack_2900;
  fdb_kvs_handle **ppfStack_28f8;
  fdb_kvs_handle *pfStack_28f0;
  fdb_kvs_handle *apfStack_28e8 [9];
  fdb_kvs_config fStack_28a0;
  timeval tStack_2888;
  fdb_kvs_handle *apfStack_2878 [33];
  fdb_config fStack_2770;
  fdb_kvs_handle *apfStack_2678 [32];
  fdb_kvs_handle *apfStack_2578 [32];
  fdb_kvs_handle afStack_2478 [15];
  fdb_config *pfStack_470;
  fdb_kvs_handle *pfStack_468;
  fdb_kvs_handle *pfStack_460;
  fdb_config *pfStack_458;
  fdb_config *pfStack_450;
  fdb_kvs_handle *pfStack_448;
  fdb_kvs_handle *pfStack_438;
  fdb_file_handle *pfStack_430;
  fdb_iterator *pfStack_428;
  fdb_doc *pfStack_420;
  fdb_kvs_handle *pfStack_418;
  undefined1 auStack_40f [31];
  undefined1 auStack_3f0 [72];
  fdb_config fStack_3a8;
  int *piStack_2b0;
  fdb_kvs_handle *pfStack_2a8;
  fdb_kvs_handle *pfStack_2a0;
  fdb_config *pfStack_298;
  fdb_config *pfStack_290;
  int local_27c;
  fdb_kvs_handle *local_278;
  fdb_file_handle *local_270;
  pthread_t local_268;
  undefined1 local_25f [31];
  fdb_config *pfStack_240;
  uint64_t local_238;
  timeval local_230;
  fdb_config local_220;
  fdb_config local_128;
  
  pfStack_290 = (fdb_config *)0x11bad9;
  gettimeofday(&local_230,(__timezone_ptr_t)0x0);
  pfStack_290 = (fdb_config *)0x11bade;
  memleak_start();
  local_27c = 10000;
  if (args != (void *)0x0) goto LAB_0011be6f;
  pfStack_290 = (fdb_config *)0x11bafb;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_290 = (fdb_config *)0x11bb08;
  fdb_get_default_config();
  fconfig_00 = &local_128;
  pfStack_290 = (fdb_config *)0x11bb20;
  memcpy(fconfig_00,&local_220,0xf8);
  local_128.block_reusing_threshold = 0;
  pfStack_290 = (fdb_config *)0x11bb3f;
  fVar2 = fdb_open(&local_270,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_290 = (fdb_config *)0x11bb54;
    fdb_get_default_kvs_config();
    local_238 = local_220.wal_threshold;
    local_25f._23_2_ = local_220.chunksize;
    local_25f._25_2_ = local_220._2_2_;
    local_25f._27_4_ = local_220.blocksize;
    pfStack_240 = (fdb_config *)local_220.buffercache_size;
    pfStack_290 = (fdb_config *)0x11bb76;
    fVar2 = fdb_kvs_open_default(local_270,&local_278,(fdb_kvs_config *)(local_25f + 0x17));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
    if (0 < local_27c) {
      unaff_R13 = (fdb_kvs_handle *)0x1;
      args = (int *)CONCAT71((int7)((ulong)&local_220 >> 8),1);
      uVar9 = 0;
      do {
        uVar8 = uVar9 + 1;
        unaff_RBP = (fdb_kvs_handle *)(ulong)uVar8;
        pfStack_290 = (fdb_config *)0x11bbb0;
        sprintf(local_25f,"%d",unaff_RBP);
        unaff_R12 = local_278;
        pfStack_290 = (fdb_config *)0x11bbbd;
        sVar4 = strlen(local_25f);
        pfStack_290 = (fdb_config *)0x11bbd8;
        fVar2 = fdb_set_kv(unaff_R12,local_25f,sVar4,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pfStack_290 = (fdb_config *)0x11be65;
          rollback_during_ops_test();
          goto LAB_0011be65;
        }
        piVar5 = (int *)args;
        if ((int)((ulong)unaff_R13 / 10) * 10 - 1U == uVar9) {
          piVar5 = (int *)((ulong)args & 0xffffffff ^ 1);
          pfStack_290 = (fdb_config *)0x11bc18;
          fdb_commit(local_270,~(byte)args & 1);
        }
        unaff_R13 = (fdb_kvs_handle *)(ulong)((int)unaff_R13 + 1);
        args = piVar5;
        uVar9 = uVar8;
      } while ((int)uVar8 < local_27c);
    }
    unaff_RBP = (fdb_kvs_handle *)0x1;
    pfStack_290 = (fdb_config *)0x11bc3f;
    fdb_commit(local_270,'\x01');
    pfStack_290 = (fdb_config *)0x11bc4e;
    fdb_get_kvs_info(local_278,(fdb_kvs_info *)&local_220);
    args = (void *)((long)&local_220 + 8);
    if ((fdb_config *)local_220.buffercache_size != (fdb_config *)(long)local_27c) {
      pfStack_290 = (fdb_config *)0x11bc6a;
      rollback_during_ops_test();
    }
    pfStack_290 = (fdb_config *)0x11bc82;
    pthread_create(&local_268,(pthread_attr_t *)0x0,rollback_during_ops_test,&local_27c);
    fconfig_00 = (fdb_config *)0x156958;
    unaff_R15 = (fdb_config *)local_25f;
    unaff_R12 = (fdb_kvs_handle *)0x1565bd;
    do {
      pfStack_290 = (fdb_config *)0x11bca4;
      sprintf((char *)unaff_R15,"%d",unaff_RBP);
      unaff_R13 = local_278;
      pfStack_290 = (fdb_config *)0x11bcb1;
      sVar4 = strlen((char *)unaff_R15);
      pfStack_290 = (fdb_config *)0x11bcc8;
      fVar2 = fdb_set_kv(unaff_R13,unaff_R15,sVar4,"value",5);
      if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
        pfStack_290 = (fdb_config *)0x11bce4;
        fVar2 = fdb_commit(local_270,'\x01');
        if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
        goto LAB_0011be6a;
      }
      uVar9 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_kvs_handle *)(ulong)uVar9;
    } while (uVar9 != 0x2711);
    pfStack_290 = (fdb_config *)0x11bd0a;
    pthread_join(local_268,(void **)(local_25f + 0xf));
    pfStack_290 = (fdb_config *)0x11bd2d;
    fVar2 = fdb_set_kv(local_278,"key1",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
    pfStack_290 = (fdb_config *)0x11bd44;
    fVar2 = fdb_commit(local_270,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
    pfStack_290 = (fdb_config *)0x11bd5e;
    fdb_get_kvs_info(local_278,(fdb_kvs_info *)&local_220);
    fconfig_00 = (fdb_config *)local_220.buffercache_size;
    pfStack_290 = (fdb_config *)0x11bd85;
    fVar2 = fdb_set_kv(local_278,"key2",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
    pfStack_290 = (fdb_config *)0x11bdb0;
    fVar2 = fdb_set_kv(local_278,"key3",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
    pfStack_290 = (fdb_config *)0x11bdc7;
    fVar2 = fdb_commit(local_270,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
    pfStack_290 = (fdb_config *)0x11bddc;
    fVar2 = fdb_rollback(&local_278,(fdb_seqnum_t)fconfig_00);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_290 = (fdb_config *)0x11bdf6;
      fdb_get_kvs_info(local_278,(fdb_kvs_info *)&local_220);
      if ((fdb_config *)local_220.buffercache_size != fconfig_00) {
        pfStack_290 = (fdb_config *)0x11be07;
        rollback_during_ops_test();
      }
      pfStack_290 = (fdb_config *)0x11be11;
      fdb_close(local_270);
      pfStack_290 = (fdb_config *)0x11be16;
      fdb_shutdown();
      pfStack_290 = (fdb_config *)0x11be1b;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (rollback_during_ops_test(void*)::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_290 = (fdb_config *)0x11be4c;
      fprintf(_stderr,pcVar11,"rollback during ops test");
      return (void *)0x0;
    }
  }
  else {
    pfStack_290 = (fdb_config *)0x11bf9d;
    rollback_during_ops_test();
LAB_0011bf9d:
    args = &local_220;
    pfStack_290 = (fdb_config *)0x11bfa2;
    rollback_during_ops_test();
LAB_0011bfa2:
    pfStack_290 = (fdb_config *)0x11bfa7;
    rollback_during_ops_test();
LAB_0011bfa7:
    pfStack_290 = (fdb_config *)0x11bfac;
    rollback_during_ops_test();
LAB_0011bfac:
    pfStack_290 = (fdb_config *)0x11bfb1;
    rollback_during_ops_test();
LAB_0011bfb1:
    pfStack_290 = (fdb_config *)0x11bfb6;
    rollback_during_ops_test();
LAB_0011bfb6:
    pfStack_290 = (fdb_config *)0x11bfbb;
    rollback_during_ops_test();
  }
  pfStack_290 = (fdb_config *)0x11bfc0;
  rollback_during_ops_test();
LAB_0011bfc0:
  pfStack_290 = (fdb_config *)0x11bfc5;
  rollback_during_ops_test();
  goto LAB_0011bfc5;
LAB_0011c266:
  pfStack_448 = (fdb_kvs_handle *)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_2900 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_2900 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_2900 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_2900 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_2900 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_2900 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_2900 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_2e08 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011be65:
  pfStack_290 = (fdb_config *)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  pfStack_290 = (fdb_config *)0x11be6f;
  rollback_during_ops_test();
LAB_0011be6f:
  fconfig_00 = &local_220;
  pfStack_290 = (fdb_config *)0x11be7c;
  fdb_get_default_config();
  unaff_R15 = &local_128;
  pfStack_290 = (fdb_config *)0x11be94;
  memcpy(unaff_R15,fconfig_00,0xf8);
  local_128.block_reusing_threshold = 0;
  pfStack_290 = (fdb_config *)0x11beb3;
  fVar2 = fdb_open(&local_270,"mvcc_test1",unaff_R15);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
  fconfig_00 = &local_220;
  pfStack_290 = (fdb_config *)0x11bec8;
  fdb_get_default_kvs_config();
  local_238 = local_220.wal_threshold;
  local_25f._23_2_ = local_220.chunksize;
  local_25f._25_2_ = local_220._2_2_;
  local_25f._27_4_ = local_220.blocksize;
  pfStack_240 = (fdb_config *)local_220.buffercache_size;
  pfStack_290 = (fdb_config *)0x11beeb;
  fVar2 = fdb_kvs_open_default(local_270,&local_278,(fdb_kvs_config *)(local_25f + 0x17));
  if (fVar2 == FDB_RESULT_SUCCESS) {
    local_27c = *args;
    if (1 < (long)local_27c) {
      unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
      fconfig_00 = (fdb_config *)0x156958;
      unaff_R15 = (fdb_config *)local_25f;
      unaff_R12 = (fdb_kvs_handle *)0x1565bd;
      args = (int *)(long)local_27c;
      do {
        pfStack_290 = (fdb_config *)0x11bf2c;
        sprintf((char *)unaff_R15,"%d",(ulong)args & 0xffffffff);
        unaff_RBP = local_278;
        pfStack_290 = (fdb_config *)0x11bf39;
        sVar4 = strlen((char *)unaff_R15);
        pfStack_290 = (fdb_config *)0x11bf50;
        fVar2 = fdb_set_kv(unaff_RBP,unaff_R15,sVar4,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
        if ((int)(((ulong)args & 0xffffffff) / 10) * -10 + (int)args == 0) {
          pfStack_290 = (fdb_config *)0x11bf76;
          fVar2 = fdb_rollback(&local_278,(fdb_seqnum_t)args);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
        }
        bVar1 = 2 < (long)args;
        args = (void *)((long)args + -1);
      } while (bVar1);
    }
    pfStack_290 = (fdb_config *)0x11bf91;
    fdb_close(local_270);
    pfStack_290 = (fdb_config *)0x11bf98;
    pthread_exit((void *)0x0);
  }
LAB_0011bfc5:
  pfStack_290 = (fdb_config *)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  pfStack_290 = (fdb_config *)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  pfStack_290 = (fdb_config *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_448 = (fdb_kvs_handle *)0x11bff0;
  piStack_2b0 = (int *)args;
  pfStack_2a8 = unaff_R12;
  pfStack_2a0 = unaff_R13;
  pfStack_298 = fconfig_00;
  pfStack_290 = unaff_R15;
  gettimeofday((timeval *)(auStack_40f + 0xf),(__timezone_ptr_t)0x0);
  pfStack_448 = (fdb_kvs_handle *)0x11bff5;
  memleak_start();
  pfStack_448 = (fdb_kvs_handle *)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig = &fStack_3a8;
  pfStack_448 = (fdb_kvs_handle *)0x11c011;
  fdb_get_default_config();
  pfStack_448 = (fdb_kvs_handle *)0x11c025;
  fVar2 = fdb_open(&pfStack_430,"mvcc_test1",fconfig);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig = (fdb_config *)(auStack_3f0 + 0x30);
    pfStack_448 = (fdb_kvs_handle *)0x11c03d;
    fdb_get_default_kvs_config();
    pfStack_448 = (fdb_kvs_handle *)0x11c04f;
    fVar2 = fdb_kvs_open_default(pfStack_430,&pfStack_438,(fdb_kvs_config *)fconfig);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig = (fdb_config *)0x1;
    fconfig_00 = (fdb_config *)0x156958;
    unaff_R15 = (fdb_config *)auStack_40f;
    unaff_R12 = (fdb_kvs_handle *)0x1565bd;
    do {
      pfStack_448 = (fdb_kvs_handle *)0x11c07e;
      sprintf((char *)unaff_R15,"%d",fconfig);
      unaff_R13 = pfStack_438;
      pfStack_448 = (fdb_kvs_handle *)0x11c08b;
      sVar4 = strlen((char *)unaff_R15);
      pfStack_448 = (fdb_kvs_handle *)0x11c0a2;
      fVar2 = fdb_set_kv(unaff_R13,unaff_R15,sVar4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_448 = (fdb_kvs_handle *)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar9 = (int)fconfig + 1;
      fconfig = (fdb_config *)(ulong)uVar9;
    } while (uVar9 != 4);
    pfStack_448 = (fdb_kvs_handle *)0x11c0bd;
    fdb_commit(pfStack_430,'\0');
    pfStack_448 = (fdb_kvs_handle *)0x11c0e0;
    fVar2 = fdb_set_kv(pfStack_438,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    pfStack_448 = (fdb_kvs_handle *)0x11c10b;
    fVar2 = fdb_set_kv(pfStack_438,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    pfStack_448 = (fdb_kvs_handle *)0x11c122;
    fVar2 = fdb_commit(pfStack_430,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    pfStack_448 = (fdb_kvs_handle *)0x11c139;
    fVar2 = fdb_rollback(&pfStack_438,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig = (fdb_config *)auStack_3f0;
    pfStack_448 = (fdb_kvs_handle *)0x11c153;
    fdb_get_kvs_info(pfStack_438,(fdb_kvs_info *)fconfig);
    if (auStack_3f0._8_8_ != 3) {
      pfStack_448 = (fdb_kvs_handle *)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    pfStack_448 = (fdb_kvs_handle *)0x11c17a;
    fVar2 = fdb_snapshot_open(pfStack_438,&pfStack_418,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    pfStack_448 = (fdb_kvs_handle *)0x11c1a2;
    fdb_iterator_init(pfStack_418,&pfStack_428,(void *)0x0,0,(void *)0x0,0,0);
    fconfig = (fdb_config *)&pfStack_420;
    pfStack_420 = (fdb_doc *)0x0;
    fconfig_00 = (fdb_config *)0x3;
    do {
      pfStack_448 = (fdb_kvs_handle *)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_428,(fdb_doc **)fconfig);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      pfStack_448 = (fdb_kvs_handle *)0x11c1d3;
      fdb_doc_free(pfStack_420);
      pfStack_420 = (fdb_doc *)0x0;
      pfStack_448 = (fdb_kvs_handle *)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_428);
      fconfig_00 = (fdb_config *)&fconfig_00[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_00 == (fdb_config *)0x0) {
      pfStack_448 = (fdb_kvs_handle *)0x11c201;
      fdb_iterator_close(pfStack_428);
      pfStack_448 = (fdb_kvs_handle *)0x11c20b;
      fdb_kvs_close(pfStack_418);
      pfStack_448 = (fdb_kvs_handle *)0x11c215;
      fdb_close(pfStack_430);
      pfStack_448 = (fdb_kvs_handle *)0x11c21a;
      fdb_shutdown();
      pfStack_448 = (fdb_kvs_handle *)0x11c21f;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_448 = (fdb_kvs_handle *)0x11c250;
      iVar3 = fprintf(_stderr,pcVar11,"in-memory snapshot rollback test");
      return (void *)CONCAT44(extraout_var,iVar3);
    }
  }
  else {
LAB_0011c26b:
    pfStack_448 = (fdb_kvs_handle *)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    pfStack_448 = (fdb_kvs_handle *)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    pfStack_448 = (fdb_kvs_handle *)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    pfStack_448 = (fdb_kvs_handle *)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    pfStack_448 = (fdb_kvs_handle *)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    pfStack_448 = (fdb_kvs_handle *)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    pfStack_448 = (fdb_kvs_handle *)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  pfStack_448 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_2900 = (code *)0x11c2b0;
  pfStack_470 = fconfig;
  pfStack_468 = unaff_R12;
  pfStack_460 = unaff_R13;
  pfStack_458 = fconfig_00;
  pfStack_450 = unaff_R15;
  pfStack_448 = unaff_RBP;
  gettimeofday(&tStack_2888,(__timezone_ptr_t)0x0);
  pcStack_2900 = (code *)0x11c2b5;
  memleak_start();
  pcStack_2900 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2900 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_2900 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_2770.wal_threshold = 0x400;
  fStack_2770.compaction_mode = 0;
  fStack_2770.durability_opt = 2;
  pfVar13 = (fdb_kvs_handle *)(apfStack_2578 + 0x20);
  ppfVar7 = apfStack_2878;
  pcVar11 = "kvs%d";
  uVar10 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_2900 = (code *)0x11c31b;
    sprintf((char *)ppfVar7,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar6 = (char *)(apfStack_28e8 + (long)__s);
    pcStack_2900 = (code *)0x11c336;
    ppfVar12 = (fdb_kvs_handle **)pcVar6;
    fVar2 = fdb_open((fdb_file_handle **)pcVar6,(char *)ppfVar7,(fdb_config *)(apfStack_2878 + 0x21)
                    );
    iVar3 = (int)ppfVar12;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar12 = (fdb_kvs_handle **)0x0;
    ppfStack_28f8 = __s;
    pfStack_28f0 = pfVar13;
    do {
      __s = ppfVar12;
      pcStack_2900 = (code *)0x11c35b;
      sprintf((char *)ppfVar7,"kvs%d",(ulong)(uint)((int)__s + (int)uVar10));
      pfVar14 = *(fdb_kvs_handle **)pcVar6;
      pcStack_2900 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar14,(fdb_kvs_handle **)pfVar13,(char *)ppfVar7,
                           (fdb_kvs_config *)(apfStack_28e8 + 9));
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_2900 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp;
      ppfVar12 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_28f8 + 1);
    uVar10 = uVar10 + 0x80;
    pfVar13 = (fdb_kvs_handle *)&pfStack_28f0[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_2878 + 0x40;
  ppfVar7 = apfStack_2578;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    uVar10 = 0;
    do {
      pcStack_2900 = (code *)0x11c3cf;
      sprintf((char *)__s,"key%08d",uVar10);
      pcStack_2900 = (code *)0x11c3e2;
      sprintf((char *)ppfVar7,"value%08d",uVar10);
      pcVar11 = (char *)apfStack_2578[(long)&pfVar13->op_stats];
      pcStack_2900 = (code *)0x11c3f2;
      sVar4 = strlen((char *)__s);
      pcVar6 = (char *)(sVar4 + 1);
      pcStack_2900 = (code *)0x11c3fe;
      sVar4 = strlen((char *)ppfVar7);
      pcStack_2900 = (code *)0x11c413;
      pfVar14 = (fdb_kvs_handle *)pcVar11;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar11,__s,(size_t)pcVar6,ppfVar7,sVar4 + 1);
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != 10);
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
  } while (pfVar13 != (fdb_kvs_handle *)0x400);
  pcVar6 = (char *)0x0;
  do {
    pfVar14 = apfStack_28e8[(long)pcVar6];
    if (((ulong)pcVar6 & 1) == 0) {
      pcStack_2900 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar14,'\0');
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_2900 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar14,'\x01');
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar6 = (char *)((long)pcVar6 + 1);
  } while (pcVar6 != (char *)0x8);
  pcVar6 = "key%08d";
  __s = apfStack_2878 + 0x40;
  ppfVar7 = (fdb_kvs_handle **)0x0;
  do {
    uVar10 = 0;
    do {
      pcStack_2900 = (code *)0x11c488;
      sprintf((char *)__s,"key%08d",uVar10);
      pfVar13 = apfStack_2578[(long)(ppfVar7 + 4)];
      pcStack_2900 = (code *)0x11c498;
      sVar4 = strlen((char *)__s);
      pcStack_2900 = (code *)0x11c4a7;
      pfVar14 = pfVar13;
      fVar2 = fdb_del_kv(pfVar13,__s,sVar4 + 1);
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != 10);
    ppfVar7 = (fdb_kvs_handle **)((long)ppfVar7 + 1);
  } while (ppfVar7 != (fdb_kvs_handle **)0x400);
  pcVar6 = (char *)0x0;
  do {
    pfVar14 = apfStack_28e8[(long)pcVar6];
    if (((ulong)pcVar6 & 1) == 0) {
      pcStack_2900 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar14,'\0');
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_2900 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar14,'\x01');
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar6 = (char *)((long)pcVar6 + 1);
  } while (pcVar6 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar6 = (char *)(apfStack_2578 + 0x20);
  do {
    pcStack_2900 = (code *)0x11c515;
    ppfVar12 = (fdb_kvs_handle **)pcVar6;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar6,10);
    iVar3 = (int)ppfVar12;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    __s = __s + 8;
    pcVar6 = (char *)((long)pcVar6 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar7 = apfStack_28e8;
  pcVar6 = "kvs%d";
  __s = apfStack_2878;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pfVar14 = apfStack_2578[(long)&pfVar13->op_stats];
    pcStack_2900 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar14);
    iVar3 = (int)pfVar14;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_2900 = (code *)0x11c56d;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar13 & 0xffffffff);
    pfVar14 = *ppfVar7;
    pcStack_2900 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar14,(char *)__s);
    iVar3 = (int)pfVar14;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->config).wal_threshold;
    ppfVar7 = ppfVar7 + 1;
  } while (pfVar13 != (fdb_kvs_handle *)0x400);
  pcVar6 = (char *)0x0;
  do {
    pfVar14 = apfStack_28e8[(long)pcVar6];
    if (((ulong)pcVar6 & 1) == 0) {
      pcStack_2900 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar14,'\0');
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_2900 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar14,'\x01');
      iVar3 = (int)pfVar14;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar6 = (char *)((long)pcVar6 + 1);
  } while (pcVar6 != (char *)0x8);
  pcVar6 = "mvcc_test_compact%d";
  __s = apfStack_2878;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_2900 = (code *)0x11c5eb;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar13 & 0xffffffff);
    pfVar14 = apfStack_28e8[(long)pfVar13];
    pcStack_2900 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar14,(char *)__s);
    iVar3 = (int)pfVar14;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
  } while (pfVar13 != (fdb_kvs_handle *)0x8);
  pcVar6 = (char *)0x0;
  pcStack_2900 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar14 = apfStack_28e8[(long)pcVar6];
    pcStack_2900 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar14);
    iVar3 = (int)pfVar14;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar6 = (char *)((long)pcVar6 + 1);
    if (pcVar6 == (char *)0x8) {
      pcStack_2900 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_2900 = (code *)0x11c633;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pcStack_2900 = (code *)0x11c664;
      iVar3 = fprintf(_stderr,pcVar11,"open multi files kvs test");
      return (void *)CONCAT44(extraout_var_00,iVar3);
    }
  }
LAB_0011c69e:
  pcStack_2900 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_2900 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_2900 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_2900 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_2900 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_2900 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_2900 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_2e08 = (code *)0x11c6e3;
  ppfStack_2928 = (fdb_kvs_handle **)pcVar6;
  ppfStack_2920 = ppfVar7;
  pfStack_2918 = (fdb_kvs_handle *)pcVar11;
  ppfStack_2910 = __s;
  pfStack_2908 = pfVar13;
  pcStack_2900 = (code *)uVar10;
  gettimeofday(&tStack_2d80,(__timezone_ptr_t)0x0);
  pcStack_2e08 = (code *)0x11c6e8;
  memleak_start();
  pcStack_2e08 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_2e08 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_2a20.flags = 1;
  fStack_2a20.block_reusing_threshold = 0;
  fStack_2a20.seqtree_opt = 0;
  pcStack_2e08 = (code *)0x11c728;
  fStack_2a20.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2e08 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_2df0,"./mvcc_test1",(fdb_config *)(acStack_2b20 + 0x100));
  iStack_2dcc = iVar3;
  if (iVar3 == 0) {
    pcStack_2e08 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_2df0,apfStack_2dc0,&fStack_2da0);
    pcVar11 = (char *)0x1;
  }
  else {
    ppfVar7 = apfStack_2dc0;
    uVar10 = 0;
    do {
      pcStack_2e08 = (code *)0x11c76d;
      sprintf(acStack_2d88,"kv%d",uVar10 & 0xffffffff);
      pcStack_2e08 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_2df0,ppfVar7,acStack_2d88,&fStack_2da0);
      uVar10 = uVar10 + 1;
      ppfVar7 = ppfVar7 + 1;
    } while (uVar10 != 3);
    pcVar11 = (char *)0x3;
  }
  uStack_2df4 = 0;
  do {
    uVar10 = 0;
    do {
      pcStack_2e08 = (code *)0x11c7d4;
      sprintf(acStack_2c20,"key%d",uVar10 & 0xffffffff);
      pcStack_2e08 = (code *)0x11c7f5;
      sprintf(acStack_2d70,"meta-%d-%d",(ulong)uStack_2df4,uVar10 & 0xffffffff);
      pcStack_2e08 = (code *)0x11c814;
      sprintf(acStack_2b20,"body-%d-%d",(ulong)uStack_2df4,uVar10 & 0xffffffff);
      doc = (btree *)(&bStack_2c70.ksize + uVar10 * 8);
      pcStack_2e08 = (code *)0x11c827;
      sVar4 = strlen(acStack_2c20);
      pcStack_2e08 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_2d70);
      pcStack_2e08 = (code *)0x11c842;
      bodylen = strlen(acStack_2b20);
      pcStack_2e08 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc,acStack_2c20,sVar4,acStack_2d70,metalen._M_i,acStack_2b20,
                     bodylen);
      pfVar13 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_2e08 = (code *)0x11c878;
        fdb_set(apfStack_2dc0[(long)pfVar13],*(fdb_doc **)doc);
        pfVar13 = (fdb_kvs_handle *)((long)pfVar13 + 1);
      } while ((fdb_kvs_handle *)pcVar11 != pfVar13);
      pcStack_2e08 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_2c70.ksize + uVar10 * 8));
      uVar10 = uVar10 + 1;
    } while (uVar10 != 10);
    pcStack_2e08 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_2df0,~(byte)uStack_2df4 & 1);
    uStack_2df4 = uStack_2df4 + 1;
    pcVar6 = (char *)(ulong)uStack_2df4;
  } while (uStack_2df4 != 5);
  pcStack_2e08 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_2df0,&pfStack_2dd8,&uStack_2da8);
  pfVar14 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_2e08 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_2dc0,(pfStack_2dd8[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_2de8 = (fdb_kvs_handle *)0x0;
    pcVar6 = acStack_2b20;
    pfVar14 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_2e08 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_2dc0[(long)pfVar14],&pfStack_2dc8,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_2e08 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_2e08 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_2e08 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_2e08 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_2e08 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_2dc8,&pfStack_2de0,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_2e08 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_2e08 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_2de0,(fdb_doc **)&pfStack_2de8);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_2e08 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_2e08 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_2e08 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_2e08 = (code *)0x11c98b;
        sprintf(acStack_2c20,"key%d",metalen._M_i);
        if (pfVar14 == (fdb_kvs_handle *)0x0) {
          pcStack_2e08 = (code *)0x11c9da;
          sprintf(acStack_2d70,"meta-1-%d",metalen._M_i);
          pcStack_2e08 = (code *)0x11c9ee;
          sprintf(pcVar6,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_2e08 = (code *)0x11c9ae;
          sprintf(acStack_2d70,"meta-%d-%d",4,metalen._M_i);
          pcStack_2e08 = (code *)0x11c9c7;
          sprintf(pcVar6,"body-%d-%d",4);
        }
        pfVar13 = pfStack_2de8;
        doc = (btree *)pfStack_2de8->op_stats;
        pcStack_2e08 = (code *)0x11ca0a;
        iVar3 = bcmp(doc,acStack_2c20,*(size_t *)&pfStack_2de8->kvs_config);
        if (iVar3 != 0) {
          pcStack_2e08 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc = pfVar13->staletree;
        pcStack_2e08 = (code *)0x11ca2a;
        iVar3 = bcmp(doc,acStack_2d70,(size_t)(pfVar13->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cba4;
        doc = (pfVar13->field_6).seqtree;
        pcStack_2e08 = (code *)0x11ca45;
        iVar3 = bcmp(doc,pcVar6,(size_t)(pfVar13->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011cb94;
        pcStack_2e08 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar13);
        pfStack_2de8 = (fdb_kvs_handle *)0x0;
        uVar9 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar9;
        pcStack_2e08 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_2de0);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar9 != 10) goto LAB_0011cbbe;
      pcStack_2e08 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_2de0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_2e08 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_2dc8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
    } while (pfVar14 != (fdb_kvs_handle *)pcVar11);
    pcVar6 = (char *)0x0;
    do {
      pcStack_2e08 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_2dc0[(long)pcVar6]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar6 = pcVar6 + 1;
    } while (pcVar11 != pcVar6);
    pcStack_2e08 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_2df0,pfStack_2dd8[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_2e08 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_2dd8,uStack_2da8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_2e08 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_2df0);
      pcStack_2e08 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_2e08 = (code *)0x11cb10;
      memleak_end();
      pcVar11 = "single kv mode:";
      if ((char)iStack_2dcc != '\0') {
        pcVar11 = "multiple kv mode:";
      }
      pcStack_2e08 = (code *)0x11cb40;
      sprintf(acStack_2b20,"rollback without seqtree in %s",pcVar11);
      pcVar11 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pcStack_2e08 = (code *)0x11cb6d;
      iVar3 = fprintf(_stderr,pcVar11,acStack_2b20);
      return (void *)CONCAT44(extraout_var_01,iVar3);
    }
  }
  else {
LAB_0011cbd2:
    pcStack_2e08 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_2e08 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_2e08 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_2e08 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cc03;
  pcStack_2e30 = pcVar6;
  aStack_2e28.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_2e20 = doc;
  pfStack_2e18 = pfVar13;
  pfStack_2e10 = pfVar14;
  pcStack_2e08 = (code *)pcVar11;
  gettimeofday(&tStack_2f80,(__timezone_ptr_t)0x0);
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar11 = auStack_2f70 + 0x48;
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_2fe0 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_2fd8,"./mvcc_test2",(fdb_config *)pcVar11);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar11 = auStack_2f70;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_2f88 = (btreeblk_handle *)auStack_2f70._16_8_;
    pfStack_2f98 = (filemgr *)auStack_2f70._0_8_;
    pdStack_2f90 = (docio_handle *)auStack_2f70._8_8_;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_2fd8,&pfStack_2fd0,(fdb_kvs_config *)&pfStack_2f98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_2fd8,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar11 = "key%d";
    pfVar13 = (fdb_kvs_handle *)acStack_2fc7;
    pfVar14 = (fdb_kvs_handle *)0x1565bd;
    uVar10 = 0;
    do {
      pfStack_2fe0 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar13,"key%d",uVar10);
      handle = pfStack_2fd0;
      pfStack_2fe0 = (fdb_kvs_handle *)0x11ccbb;
      sVar4 = strlen((char *)pfVar13);
      pfStack_2fe0 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(handle,pfVar13,sVar4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_2fe0 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != 10);
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_2fd8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_2fd8,"./mvcc_test3");
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_2fd8,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar11 = "key%d";
    pfVar13 = (fdb_kvs_handle *)acStack_2fc7;
    uVar9 = 0;
    do {
      pfStack_2fe0 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar13,"key%d",(ulong)uVar9);
      pfVar14 = pfStack_2fd0;
      pfStack_2fe0 = (fdb_kvs_handle *)0x11cd47;
      sVar4 = strlen((char *)pfVar13);
      pfStack_2fe0 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar14,pfVar13,sVar4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 10);
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_2fd8,(fdb_file_info *)auStack_2f70);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar11 = (char *)((ulong)auStack_2f70._40_8_ / (ulong)uStack_2f24);
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_2fd8);
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cdbe;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_2f24 * (long)pcVar11,
                       (ulong)((uStack_2f24 >> 2) + uStack_2f24 * 2));
    if (iVar3 < 0) goto LAB_0011cf90;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cde8;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar11 * 4 + 8) * (ulong)uStack_2f24,
                       (ulong)(uStack_2f24 >> 2));
    if (iVar3 < 0) goto LAB_0011cf95;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_2fd8,"./mvcc_test3",(fdb_config *)(auStack_2f70 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar11 = (char *)&pfStack_2fb8;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_2f88 = pbStack_2fa8;
    pfStack_2f98 = pfStack_2fb8;
    pdStack_2f90 = pdStack_2fb0;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_2fd8,&pfStack_2fd0,(fdb_kvs_config *)&pfStack_2f98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_2fe0 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_2fd8,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar9 = 0;
      do {
        pfStack_2fe0 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_2fc7,"key%d",(ulong)uVar9);
        pfVar14 = pfStack_2fd0;
        pfStack_2fe0 = (fdb_kvs_handle *)0x11ce85;
        sVar4 = strlen(acStack_2fc7);
        pfStack_2fe0 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar14,acStack_2fc7,sVar4);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 10);
      pfStack_2fe0 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_2fd8);
      pfVar14 = (fdb_kvs_handle *)&pfStack_2fb8;
      uVar9 = 0;
      while( true ) {
        pfStack_2fe0 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_2fc7,"key%d",(ulong)uVar9);
        pfVar13 = pfStack_2fd0;
        pfStack_2fe0 = (fdb_kvs_handle *)0x11cedf;
        sVar4 = strlen(acStack_2fc7);
        pfStack_2fe0 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar13,acStack_2fc7,sVar4,(void **)pfVar14,&sStack_2fa0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_2fe0 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_2fb8);
        uVar9 = uVar9 + 1;
        if (uVar9 == 10) {
          pfStack_2fe0 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_2fd8);
          pfStack_2fe0 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_2fe0 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pfStack_2fe0 = (fdb_kvs_handle *)0x11cf4c;
          iVar3 = fprintf(_stderr,pcVar11,"crash recover test");
          return (void *)CONCAT44(extraout_var_02,iVar3);
        }
      }
LAB_0011cf6d:
      pfVar13 = (fdb_kvs_handle *)acStack_2fc7;
      pcVar11 = "key%d";
      pfStack_2fe0 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_2fe0 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_2fe0 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_2ff0 = (fdb_config *)pcVar11;
  pfStack_2fe8 = pfVar13;
  pfStack_2fe0 = pfVar14;
  gettimeofday(&tStack_3110,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_3120 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_3130,"./mvcc_test1",&fStack_30e8);
  fdb_kvs_open_default(pfStack_3130,&pfStack_3118,&fStack_3100);
  fdb_kvs_open(pfStack_3130,&pfStack_3138,"kv",&fStack_3100);
  fVar2 = fdb_set_kv(pfStack_3138,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_3138,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_3130,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_3138,&pfStack_3140,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_3140,&pfStack_3128,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_3140);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_3138);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_3130,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_3128,&pfStack_3120);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_3120);
    fVar2 = fdb_iterator_close(pfStack_3128);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_3140);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_3118);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_3130);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        iVar3 = fprintf(_stderr,pcVar11,"drop kv other handle test");
        return (void *)CONCAT44(extraout_var_03,iVar3);
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return (void *)0x0;
}

Assistant:

void *rollback_during_ops_test(void * args)
{

    TEST_INIT();
    memleak_start();

    fdb_file_handle *file;
    fdb_kvs_handle *kvs;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    fdb_seqnum_t rollback_to;
    thread_t tid;
    void *thread_ret;
    bool walflush = true;
    char str[15];
    int i, r;
    int n = 10000;

    if (args == NULL)
    { // parent

        r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
        (void)r;

        // Open Database File
        config = fdb_get_default_config();
        // disable block reusing for strict rollback
        config.block_reusing_threshold = 0;
        status = fdb_open(&file, "mvcc_test1", &config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Open KV Store
        kvs_config = fdb_get_default_kvs_config();
        status = fdb_kvs_open_default(file, &kvs, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // set with commits
        for(i=1;i<=n;i++) {
            sprintf(str, "%d", i);
            status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            if(i%10==0){
                walflush = !walflush;
                if(walflush){
                    fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
                } else {
                    fdb_commit(file, FDB_COMMIT_NORMAL);
                }
            }
        }

        fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        fdb_get_kvs_info(kvs, &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == (uint64_t)n);

        // start rollback thread
        thread_create(&tid, rollback_during_ops_test, (void *)&n);

        // updates with commits
        for(i=1;i<=10000;i++) {
            sprintf(str, "%d", i);
            status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
            if(status == FDB_RESULT_SUCCESS){ // set ok
                status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
                if(status != FDB_RESULT_SUCCESS){
                    TEST_CHK(status == FDB_RESULT_FAIL_BY_ROLLBACK);
                }
            } else {
                TEST_CHK(status == FDB_RESULT_FAIL_BY_ROLLBACK);
            }
        }

        // join rollback thread
        thread_join(tid, &thread_ret);

        // set a keys commit and save seqnum
        status = fdb_set_kv(kvs,(void *)"key1", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_get_kvs_info(kvs, &kvs_info);
        rollback_to = kvs_info.last_seqnum;

        // 2 more sets
        status = fdb_set_kv(kvs,(void *)"key2", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_kv(kvs,(void *)"key3", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // rollback to last saved seqnum
        status = fdb_rollback(&kvs, rollback_to);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_get_kvs_info(kvs, &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == rollback_to);

        fdb_close(file);
        fdb_shutdown();

        memleak_end();
        TEST_RESULT("rollback during ops test");
        return NULL;
    }

    // open new copy of dbfile and kvs
    config = fdb_get_default_config();
    // disable block reusing for strict rollback
    config.block_reusing_threshold = 0;
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // reverse set with rollbacks
    n = *((int *)args);
    for(i=n;i>1;i--){
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if(i%10 == 0){
            status = fdb_rollback(&kvs, i);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    fdb_close(file);
    // exit
    thread_exit(0);
    return NULL;

}